

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::RadixHTGlobalSinkState::RadixHTGlobalSinkState
          (RadixHTGlobalSinkState *this,ClientContext *context_p,
          RadixPartitionedHashTable *radix_ht_p)

{
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
  *this_00;
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  byte bVar4;
  int32_t iVar5;
  int iVar6;
  ClientContext *context;
  TaskScheduler *pTVar7;
  unsigned_long uVar8;
  BufferManager *pBVar9;
  undefined4 extraout_var;
  type pTVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pTVar13;
  pointer *__ptr;
  undefined1 auVar14 [16];
  double dVar15;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__RadixHTGlobalSinkState_0196ff28;
  this->context = context_p;
  context = (ClientContext *)TemporaryMemoryManager::Get(context_p);
  this_00 = &this->temporary_memory_state;
  TemporaryMemoryManager::Register((TemporaryMemoryManager *)this_00,context);
  this->finalized = false;
  this->external = (__atomic_base<bool>)0x0;
  (this->active_threads).super___atomic_base<unsigned_long>._M_i = 0;
  pTVar7 = TaskScheduler::GetScheduler(this->context);
  iVar5 = TaskScheduler::NumberOfThreads(pTVar7);
  uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar5);
  this->number_of_threads = uVar8;
  (this->any_combined)._M_base._M_i = false;
  this->radix_ht = radix_ht_p;
  RadixHTConfig::RadixHTConfig(&this->config,this);
  (this->partitions).
  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions).
  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->stored_allocators_size = 0;
  (this->partitions).
  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stored_allocators).
  super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stored_allocators).
  super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uncombined_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
       (PartitionedTupleData *)0x0;
  (this->stored_allocators).
  super_vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->finalize_done).super___atomic_base<unsigned_long>._M_i = 0;
  this->scan_pin_properties = DESTROY_AFTER_DONE;
  this->count_before_combining = 0;
  this->max_partition_size = 0;
  pBVar9 = BufferManager::GetBufferManager(this->context);
  iVar6 = (*pBVar9->_vptr_BufferManager[0xe])(pBVar9);
  pTVar10 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&this->radix_ht->layout_ptr);
  uVar12 = pTVar10->row_width;
  iVar2 = (this->config).sink_capacity;
  iVar3 = (this->config).maximum_sink_radix_bits;
  pTVar10 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&this->radix_ht->layout_ptr);
  auVar14._8_4_ = (int)(iVar2 >> 0x20);
  auVar14._0_8_ = iVar2;
  auVar14._12_4_ = 0x45300000;
  dVar15 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0)) / 1.25;
  uVar11 = (ulong)dVar15;
  bVar4 = (byte)iVar3;
  uVar12 = CONCAT44(extraout_var,iVar6) / uVar12;
  bVar1 = pTVar10->all_constant;
  iVar2 = (this->config).sink_capacity;
  pTVar7 = TaskScheduler::GetScheduler(this->context);
  iVar5 = TaskScheduler::NumberOfThreads(pTVar7);
  uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar5);
  LOCK();
  (this->minimum_reservation).super___atomic_base<unsigned_long>._M_i =
       uVar8 * (iVar2 * 8 +
               (((ulong)bVar1 ^ 1) +
                ((((long)(dVar15 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11) >>
                 (bVar4 & 0x3f)) + uVar12) / uVar12 << (bVar4 & 0x3f)) *
               CONCAT44(extraout_var,iVar6));
  UNLOCK();
  pTVar13 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->(this_00);
  TemporaryMemoryState::SetMinimumReservation
            (pTVar13,(this->minimum_reservation).super___atomic_base<unsigned_long>._M_i);
  pTVar13 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->(this_00);
  TemporaryMemoryState::SetRemainingSizeAndUpdateReservation
            (pTVar13,this->context,
             (this->minimum_reservation).super___atomic_base<unsigned_long>._M_i);
  return;
}

Assistant:

RadixHTGlobalSinkState::RadixHTGlobalSinkState(ClientContext &context_p, const RadixPartitionedHashTable &radix_ht_p)
    : context(context_p), temporary_memory_state(TemporaryMemoryManager::Get(context).Register(context)),
      finalized(false), external(false), active_threads(0),
      number_of_threads(NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads())),
      any_combined(false), radix_ht(radix_ht_p), config(*this), stored_allocators_size(0), finalize_done(0),
      scan_pin_properties(TupleDataPinProperties::DESTROY_AFTER_DONE), count_before_combining(0),
      max_partition_size(0) {

	// Compute minimum reservation
	auto block_alloc_size = BufferManager::GetBufferManager(context).GetBlockAllocSize();
	auto tuples_per_block = block_alloc_size / radix_ht.GetLayout().GetRowWidth();
	idx_t ht_count =
	    LossyNumericCast<idx_t>(static_cast<double>(config.sink_capacity) / GroupedAggregateHashTable::LOAD_FACTOR);
	auto num_partitions = RadixPartitioning::NumberOfPartitions(config.GetMaximumSinkRadixBits());
	auto count_per_partition = ht_count / num_partitions;
	auto blocks_per_partition = (count_per_partition + tuples_per_block) / tuples_per_block;
	if (!radix_ht.GetLayout().AllConstant()) {
		blocks_per_partition += 1;
	}
	auto ht_size = num_partitions * blocks_per_partition * block_alloc_size + config.sink_capacity * sizeof(ht_entry_t);

	// This really is the minimum reservation that we can do
	auto num_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());
	minimum_reservation = num_threads * ht_size;

	temporary_memory_state->SetMinimumReservation(minimum_reservation);
	temporary_memory_state->SetRemainingSizeAndUpdateReservation(context, minimum_reservation);
}